

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeSorterNext(sqlite3 *db,VdbeCursor *pCsr)

{
  SorterRecord *pRecord;
  SorterRecord *pFree;
  int res;
  int rc;
  VdbeSorter *pSorter;
  VdbeCursor *pCsr_local;
  sqlite3 *db_local;
  
  _res = (pCsr->uc).pSorter;
  pSorter = (VdbeSorter *)pCsr;
  pCsr_local = (VdbeCursor *)db;
  if (_res->bUsePMA == '\0') {
    pRecord = (_res->list).pList;
    (_res->list).pList = (SorterRecord *)pRecord->u;
    (pRecord->u).pNext = (SorterRecord *)0x0;
    if ((_res->list).aMemory == (u8 *)0x0) {
      vdbeSorterRecordFree(db,pRecord);
    }
    pFree._4_4_ = 0x65;
    if ((_res->list).pList != (SorterRecord *)0x0) {
      pFree._4_4_ = 0;
    }
  }
  else {
    pFree._0_4_ = 0;
    pFree._4_4_ = vdbeMergeEngineStep(_res->pMerger,(int *)&pFree);
    if ((pFree._4_4_ == 0) && ((int)pFree != 0)) {
      pFree._4_4_ = 0x65;
    }
  }
  return pFree._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterNext(sqlite3 *db, const VdbeCursor *pCsr){
  VdbeSorter *pSorter;
  int rc;                         /* Return code */

  assert( pCsr->eCurType==CURTYPE_SORTER );
  pSorter = pCsr->uc.pSorter;
  assert( pSorter->bUsePMA || (pSorter->pReader==0 && pSorter->pMerger==0) );
  if( pSorter->bUsePMA ){
    assert( pSorter->pReader==0 || pSorter->pMerger==0 );
    assert( pSorter->bUseThreads==0 || pSorter->pReader );
    assert( pSorter->bUseThreads==1 || pSorter->pMerger );
#if SQLITE_MAX_WORKER_THREADS>0
    if( pSorter->bUseThreads ){
      rc = vdbePmaReaderNext(pSorter->pReader);
      if( rc==SQLITE_OK && pSorter->pReader->pFd==0 ) rc = SQLITE_DONE;
    }else
#endif
    /*if( !pSorter->bUseThreads )*/ {
      int res = 0;
      assert( pSorter->pMerger!=0 );
      assert( pSorter->pMerger->pTask==(&pSorter->aTask[0]) );
      rc = vdbeMergeEngineStep(pSorter->pMerger, &res);
      if( rc==SQLITE_OK && res ) rc = SQLITE_DONE;
    }
  }else{
    SorterRecord *pFree = pSorter->list.pList;
    pSorter->list.pList = pFree->u.pNext;
    pFree->u.pNext = 0;
    if( pSorter->list.aMemory==0 ) vdbeSorterRecordFree(db, pFree);
    rc = pSorter->list.pList ? SQLITE_OK : SQLITE_DONE;
  }
  return rc;
}